

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module_ * __thiscall
pybind11::module_::
def<void(*)(SequenceDistanceGraph&,PairedReadsDatastore_const&,int,int,int,int),pybind11::return_value_policy,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
          (module_ *this,char *name_,
          _func_void_SequenceDistanceGraph_ptr_PairedReadsDatastore_ptr_int_int_int_int **f,
          return_value_policy *extra,arg *extra_1,arg *extra_2,arg *extra_3,arg *extra_4,
          arg *extra_5,arg *extra_6)

{
  handle in_RCX;
  arg *in_RDX;
  arg *in_RSI;
  arg *in_RDI;
  arg *in_R8;
  arg *in_R9;
  cpp_function func;
  handle *in_stack_ffffffffffffff28;
  sibling *in_stack_ffffffffffffff30;
  none *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  handle in_stack_ffffffffffffff50;
  handle in_stack_ffffffffffffff58;
  return_value_policy *in_stack_ffffffffffffff78;
  sibling *in_stack_ffffffffffffff80;
  scope *in_stack_ffffffffffffff88;
  name *in_stack_ffffffffffffff90;
  name *f_00;
  PyObject *this_00;
  scope local_48;
  name local_40;
  undefined1 in_stack_ffffffffffffffcf;
  arg *extra_9;
  
  extra_9 = in_RDI;
  pybind11::name::name(&local_40,(char *)in_RSI);
  pybind11::scope::scope(&local_48,(handle *)in_RDI);
  this_00 = (PyObject *)in_RDI->name;
  none::none(in_stack_ffffffffffffff40);
  f_00 = in_stack_ffffffffffffff90;
  getattr(in_stack_ffffffffffffff58,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  sibling::sibling(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  cpp_function::
  cpp_function<void,SequenceDistanceGraph&,PairedReadsDatastore_const&,int,int,int,int,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::return_value_policy,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
            ((cpp_function *)this_00,
             (_func_void_SequenceDistanceGraph_ptr_PairedReadsDatastore_ptr_int_int_int_int *)f_00,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_R9,in_R8,(arg *)in_RCX.m_ptr,in_RDX,in_RSI,extra_9);
  object::~object((object *)0x28b279);
  none::~none((none *)0x28b283);
  add_object((module_ *)in_R8,(char *)in_R9,in_RCX,(bool)in_stack_ffffffffffffffcf);
  cpp_function::~cpp_function((cpp_function *)0x28b2bb);
  return (module_ *)in_RDI;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }